

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssh-certs.c
# Opt level: O3

ssh_key * opensshcert_new_priv_openssh(ssh_keyalg *self,BinarySource *src)

{
  ptrlen *ppVar1;
  uint uVar2;
  long *plVar3;
  ulong uVar4;
  long lVar5;
  void *pvVar6;
  _Bool _Var7;
  opensshcert_key *poVar8;
  strbuf *buf_o;
  ulong uVar9;
  ulong uVar10;
  ssh_key *psVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  bool bVar16;
  ptrlen pVar17;
  ptrlen pl;
  ptrlen pl1;
  ptrlen pl1_00;
  strbuf *basepub;
  BinarySource pubsrc [1];
  BinarySource osshsrc [1];
  void *local_e8;
  strbuf *local_b0;
  ssh_keyalg *local_a8;
  BinarySource *local_a0;
  long local_98;
  ulong local_90;
  BinarySource local_88;
  BinarySource local_58;
  
  plVar3 = (long *)self->extra;
  local_a0 = src;
  pVar17 = BinarySource_get_string(src->binarysource_);
  poVar8 = opensshcert_new_shared(self,pVar17,&local_b0);
  if (poVar8 == (opensshcert_key *)0x0) {
    return (ssh_key *)0x0;
  }
  local_a8 = self;
  buf_o = strbuf_new();
  local_88.data = local_b0->u;
  local_88.len = local_b0->len;
  local_88.binarysource_ = &local_88;
  local_88.pos = 0;
  local_88.err = BSE_NO_ERROR;
  BinarySource_get_string(local_88.binarysource_);
  uVar4 = plVar3[1];
  if (uVar4 == 0) {
    uVar14 = 0;
    local_e8 = (void *)0x0;
  }
  else {
    lVar5 = *plVar3;
    uVar9 = 0;
    uVar14 = 0;
    do {
      uVar13 = uVar14;
      uVar10 = (ulong)(*(int *)(lVar5 + uVar9 * 4) + 1);
      uVar14 = uVar10;
      if (uVar10 < uVar13) {
        uVar14 = uVar13;
      }
      uVar9 = uVar9 + 1;
    } while (uVar4 != uVar9);
    if (uVar14 == 0) {
      local_e8 = (void *)0x0;
    }
    else {
      local_e8 = saferealloc((void *)0x0,uVar14,0x10);
      memset(local_e8,0,uVar14 << 4);
    }
    local_98 = -uVar4;
    uVar9 = 1;
    bVar15 = false;
    local_90 = uVar4;
    do {
      uVar2 = *(uint *)(lVar5 + -4 + uVar9 * 4);
      pVar17 = BinarySource_get_string(local_88.binarysource_);
      lVar12 = (ulong)uVar2 * 0x10;
      ppVar1 = (ptrlen *)((long)local_e8 + lVar12);
      pvVar6 = *(void **)((long)local_e8 + lVar12);
      if ((pvVar6 != (void *)0x0) &&
         (pl1.len = ppVar1->len, pl1.ptr = pvVar6, _Var7 = ptrlen_eq_ptrlen(pl1,pVar17), !_Var7))
      break;
      *ppVar1 = pVar17;
      bVar15 = local_90 <= uVar9;
      lVar12 = local_98 + uVar9;
      uVar9 = uVar9 + 1;
    } while (lVar12 != 0);
    if (!bVar15) {
      uVar4 = plVar3[3];
      if (uVar4 != 0) {
        lVar5 = plVar3[2];
        if (uVar10 < uVar13) {
          uVar10 = uVar13;
        }
        uVar14 = 0;
        do {
          if (uVar10 == uVar14) {
LAB_00161417:
            __assert_fail("i < bt->nparts",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/openssh-certs.c"
                          ,0xb5,"void blobtrans_write(BlobTransformer *, BinarySink *, blob_fmt)");
          }
          lVar12 = (ulong)*(uint *)(lVar5 + uVar14 * 4) * 0x10;
          pvVar6 = *(void **)((long)local_e8 + lVar12);
          if (pvVar6 == (void *)0x0) {
LAB_00161436:
            __assert_fail("part.ptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/openssh-certs.c"
                          ,0xb7,"void blobtrans_write(BlobTransformer *, BinarySink *, blob_fmt)");
          }
          pl.len = *(size_t *)((long)local_e8 + lVar12 + 8);
          pl.ptr = pvVar6;
          BinarySink_put_stringpl(buf_o->binarysink_[0].binarysink_,pl);
          uVar14 = uVar14 + 1;
        } while (uVar4 != uVar14);
      }
      safefree(local_e8);
      goto LAB_001613e0;
    }
  }
  uVar4 = plVar3[5];
  if (uVar4 == 0) {
    bVar15 = true;
  }
  else {
    lVar5 = plVar3[4];
    uVar10 = 0;
    uVar9 = uVar14;
    do {
      uVar13 = (ulong)(*(int *)(lVar5 + uVar10 * 4) + 1);
      if (uVar13 < uVar9) {
        uVar13 = uVar9;
      }
      uVar10 = uVar10 + 1;
      uVar9 = uVar13;
    } while (uVar4 != uVar10);
    if (uVar14 <= uVar13 && uVar13 - uVar14 != 0) {
      local_e8 = saferealloc(local_e8,uVar13,0x10);
      memset((void *)(uVar14 * 0x10 + (long)local_e8),0,(uVar13 - uVar14) * 0x10);
      uVar14 = uVar13;
    }
    bVar15 = false;
    uVar9 = 1;
    do {
      uVar2 = *(uint *)(lVar5 + -4 + uVar9 * 4);
      pVar17 = BinarySource_get_string(local_a0->binarysource_);
      lVar12 = (ulong)uVar2 * 0x10;
      ppVar1 = (ptrlen *)((long)local_e8 + lVar12);
      pvVar6 = *(void **)((long)local_e8 + lVar12);
      if ((pvVar6 != (void *)0x0) &&
         (pl1_00.len = ppVar1->len, pl1_00.ptr = pvVar6, _Var7 = ptrlen_eq_ptrlen(pl1_00,pVar17),
         !_Var7)) break;
      *ppVar1 = pVar17;
      bVar15 = uVar4 <= uVar9;
      bVar16 = uVar9 != uVar4;
      uVar9 = uVar9 + 1;
    } while (bVar16);
  }
  uVar4 = plVar3[3];
  if (uVar4 != 0) {
    lVar5 = plVar3[2];
    uVar9 = 0;
    do {
      if (uVar14 == uVar9) goto LAB_00161417;
      lVar12 = (ulong)*(uint *)(lVar5 + uVar9 * 4) * 0x10;
      pvVar6 = *(void **)((long)local_e8 + lVar12);
      if (pvVar6 == (void *)0x0) goto LAB_00161436;
      pVar17.len = *(size_t *)((long)local_e8 + lVar12 + 8);
      pVar17.ptr = pvVar6;
      BinarySink_put_stringpl(buf_o->binarysink_[0].binarysink_,pVar17);
      uVar9 = uVar9 + 1;
    } while (uVar4 != uVar9);
  }
  safefree(local_e8);
  if (bVar15) {
    strbuf_free(local_b0);
    local_58.data = buf_o->u;
    local_58.len = buf_o->len;
    local_58.binarysource_ = &local_58;
    local_58.pos = 0;
    local_58.err = BSE_NO_ERROR;
    psVar11 = (*local_a8->base_alg->new_priv_openssh)(local_a8->base_alg,local_58.binarysource_);
    poVar8->basekey = psVar11;
    strbuf_free(buf_o);
    psVar11 = &poVar8->sshk;
    if (poVar8->basekey == (ssh_key *)0x0) {
      (*psVar11->vt->freekey)(psVar11);
      return (ssh_key *)0x0;
    }
    return psVar11;
  }
LAB_001613e0:
  (*((poVar8->sshk).vt)->freekey)(&poVar8->sshk);
  strbuf_free(local_b0);
  strbuf_free(buf_o);
  return (ssh_key *)0x0;
}

Assistant:

static ssh_key *opensshcert_new_priv_openssh(
    const ssh_keyalg *self, BinarySource *src)
{
    const opensshcert_extra *extra = self->extra;

    ptrlen cert = get_string(src);

    strbuf *basepub;
    opensshcert_key *ck = opensshcert_new_shared(self, cert, &basepub);
    if (!ck)
        return NULL;

    strbuf *baseossh = strbuf_new();

    /* Make the base OpenSSH key blob out of the public key blob
     * returned from opensshcert_new_shared, and the trailing
     * private data following the certificate */
    BLOBTRANS_DECLARE(bt);

    BinarySource pubsrc[1];
    BinarySource_BARE_INIT_PL(pubsrc, ptrlen_from_strbuf(basepub));
    get_string(pubsrc);            /* skip key type id */

    /* blobtrans_read might fail in this case, because we're reading
     * from two sources and they might fail to match */
    bool success = blobtrans_read(bt, pubsrc, extra->pub_fmt) &&
        blobtrans_read(bt, src, extra->cert_ossh_fmt);

    blobtrans_write(bt, BinarySink_UPCAST(baseossh), extra->base_ossh_fmt);
    blobtrans_clear(bt);

    if (!success) {
        ssh_key_free(&ck->sshk);
        strbuf_free(basepub);
        strbuf_free(baseossh);
        return NULL;
    }

    strbuf_free(basepub);

    BinarySource osshsrc[1];
    BinarySource_BARE_INIT_PL(osshsrc, ptrlen_from_strbuf(baseossh));
    ck->basekey = ssh_key_new_priv_openssh(self->base_alg, osshsrc);
    strbuf_free(baseossh);

    if (!ck->basekey) {
        ssh_key_free(&ck->sshk);
        return NULL;
    }

    return &ck->sshk;
}